

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O0

String * __thiscall
cplus::utils::List<int>::toString(String *__return_storage_ptr__,List<int> *this)

{
  cplus_list_size_t cVar1;
  undefined1 local_40 [8];
  StringBuilder stringBuilder;
  List<int> *this_local;
  
  stringBuilder._32_8_ = this;
  StringBuilder::StringBuilder((StringBuilder *)local_40);
  StringBuilder::append((StringBuilder *)local_40,"cplus::utils::List(");
  StringBuilder::append((StringBuilder *)local_40,"size:");
  cVar1 = size(this);
  StringBuilder::append((StringBuilder *)local_40,(ulong)cVar1);
  StringBuilder::append((StringBuilder *)local_40,")");
  StringBuilder::toString(__return_storage_ptr__,(StringBuilder *)local_40);
  StringBuilder::~StringBuilder((StringBuilder *)local_40);
  return __return_storage_ptr__;
}

Assistant:

inline ::cplus::lang::String toString() const override {
				StringBuilder stringBuilder;
				stringBuilder.append("cplus::utils::List(");
				stringBuilder.append("size:");
				stringBuilder.append((long) size());
				stringBuilder.append(")");
				return stringBuilder.toString();
			}